

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O0

void __thiscall QPushButton::focusInEvent(QPushButton *this,QFocusEvent *e)

{
  bool bVar1;
  int iVar2;
  QPushButtonPrivate *e_00;
  QDialog *pQVar3;
  QWidget *in_RSI;
  QPushButton *in_RDI;
  QDialogPrivate *unaff_retaddr;
  QDialog *dlg;
  QPushButtonPrivate *d;
  QPushButton *pushButton;
  
  pushButton = in_RDI;
  e_00 = d_func((QPushButton *)0x665cc0);
  iVar2 = QFocusEvent::reason();
  if (((iVar2 != 4) && (bVar1 = autoDefault(in_RDI), bVar1)) &&
     (((byte)e_00->field_0x2c8 >> 2 & 1) == 0)) {
    e_00->field_0x2c8 = e_00->field_0x2c8 & 0xfb | 4;
    QWidget::window(in_RSI);
    pQVar3 = qobject_cast<QDialog*>((QObject *)0x665d23);
    if (pQVar3 != (QDialog *)0x0) {
      QDialog::d_func((QDialog *)0x665d3a);
      QDialogPrivate::setDefault(unaff_retaddr,pushButton);
    }
  }
  QAbstractButton::focusInEvent((QAbstractButton *)in_RSI,(QFocusEvent *)e_00);
  return;
}

Assistant:

void QPushButton::focusInEvent(QFocusEvent *e)
{
    Q_D(QPushButton);
    if (e->reason() != Qt::PopupFocusReason && autoDefault() && !d->defaultButton) {
        d->defaultButton = true;
#if QT_CONFIG(dialog)
        QDialog *dlg = qobject_cast<QDialog*>(window());
        if (dlg)
            dlg->d_func()->setDefault(this);
#endif
    }
    QAbstractButton::focusInEvent(e);
}